

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_herb(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CClass *this;
  int *piVar4;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af;
  char arg [4608];
  CHAR_DATA *victim;
  AFFECT_DATA *in_stack_ffffffffffffed58;
  undefined4 in_stack_ffffffffffffed60;
  undefined4 in_stack_ffffffffffffed64;
  CHAR_DATA *in_stack_ffffffffffffed68;
  undefined4 in_stack_ffffffffffffed70;
  int in_stack_ffffffffffffed74;
  int local_1288;
  int local_1284 [7];
  undefined2 local_1266;
  short local_1264;
  short local_1262;
  undefined2 local_1260;
  undefined2 local_125e;
  undefined2 local_125c;
  undefined4 local_1248;
  char local_1218;
  int in_stack_ffffffffffffee34;
  undefined1 in_stack_ffffffffffffee3b;
  int in_stack_ffffffffffffee3c;
  CHAR_DATA *in_stack_ffffffffffffee40;
  int in_stack_ffffffffffffee5c;
  CHAR_DATA *in_stack_ffffffffffffee60;
  char *in_stack_ffffffffffffff60;
  CHAR_DATA *in_stack_ffffffffffffff68;
  CHAR_DATA *local_18;
  
  one_argument((char *)CONCAT44(in_stack_ffffffffffffed64,in_stack_ffffffffffffed60),
               (char *)in_stack_ffffffffffffed58);
  iVar2 = get_skill(in_stack_ffffffffffffee60,in_stack_ffffffffffffee5c);
  if (iVar2 != 0) {
    in_stack_ffffffffffffed74 = (int)in_RDI->level;
    in_stack_ffffffffffffed68 = (CHAR_DATA *)(skill_table + gsn_herb);
    this = char_data::Class((char_data *)
                            CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70));
    iVar2 = CClass::GetIndex(this);
    if (*(short *)((long)&in_stack_ffffffffffffed68->next_in_room + (long)iVar2 * 2) <=
        in_stack_ffffffffffffed74) {
      bVar1 = is_affected(in_RDI,(int)gsn_herb);
      if (bVar1) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     in_stack_ffffffffffffed68);
        return;
      }
      if (((in_RDI->in_room->sector_type != 3) && (in_RDI->in_room->sector_type != 4)) &&
         (in_RDI->in_room->sector_type != 5)) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     in_stack_ffffffffffffed68);
        return;
      }
      local_18 = in_RDI;
      if ((local_1218 != '\0') &&
         (local_18 = get_char_room(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60),
         local_18 == (CHAR_DATA *)0x0)) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     in_stack_ffffffffffffed68);
        return;
      }
      iVar2 = number_percent();
      iVar3 = get_skill(in_stack_ffffffffffffee60,in_stack_ffffffffffffee5c);
      if (iVar3 < iVar2) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     in_stack_ffffffffffffed68);
        act((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
            in_stack_ffffffffffffed68,(void *)CONCAT44(iVar2,in_stack_ffffffffffffed60),
            in_stack_ffffffffffffed58,0);
        check_improve(in_stack_ffffffffffffee40,in_stack_ffffffffffffee3c,
                      (bool)in_stack_ffffffffffffee3b,in_stack_ffffffffffffee34);
        return;
      }
      if (local_18 == in_RDI) {
        act((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
            in_stack_ffffffffffffed68,(void *)CONCAT44(iVar2,in_stack_ffffffffffffed60),
            in_stack_ffffffffffffed58,0);
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     in_stack_ffffffffffffed68);
      }
      else {
        act((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
            in_stack_ffffffffffffed68,(void *)CONCAT44(iVar2,in_stack_ffffffffffffed60),
            in_stack_ffffffffffffed58,0);
        act((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
            in_stack_ffffffffffffed68,(void *)CONCAT44(iVar2,in_stack_ffffffffffffed60),
            in_stack_ffffffffffffed58,0);
        act((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
            in_stack_ffffffffffffed68,(void *)CONCAT44(iVar2,in_stack_ffffffffffffed60),
            in_stack_ffffffffffffed58,0);
      }
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                   in_stack_ffffffffffffed68);
      bVar1 = is_affected_by(in_stack_ffffffffffffed68,iVar2);
      if ((bVar1) && (iVar3 = number_percent(), 0x1e < iVar3)) {
        affect_strip((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     (int)((ulong)in_stack_ffffffffffffed68 >> 0x20));
        act((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
            in_stack_ffffffffffffed68,(void *)CONCAT44(iVar2,in_stack_ffffffffffffed60),
            in_stack_ffffffffffffed58,0);
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
                     in_stack_ffffffffffffed68);
      }
      check_improve(in_stack_ffffffffffffee40,in_stack_ffffffffffffee3c,
                    (bool)in_stack_ffffffffffffee3b,in_stack_ffffffffffffee34);
      local_1284[0] = local_18->hit + in_RDI->level * 4;
      local_1288 = (int)local_18->max_hit;
      piVar4 = std::min<int>(local_1284,&local_1288);
      local_18->hit = *piVar4;
      init_affect((AFFECT_DATA *)0x5e97a9);
      local_1266 = 0;
      local_1264 = gsn_herb;
      local_125e = 0;
      local_1260 = 4;
      local_125c = 0;
      local_1248 = 1;
      local_1262 = in_RDI->level;
      affect_to_char((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffed60),
                     in_stack_ffffffffffffed58);
      return;
    }
  }
  send_to_char((char *)CONCAT44(in_stack_ffffffffffffed74,in_stack_ffffffffffffed70),
               in_stack_ffffffffffffed68);
  return;
}

Assistant:

void do_herb(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	AFFECT_DATA af;

	one_argument(argument, arg);

	if (get_skill(ch, gsn_herb) == 0 || ch->level < skill_table[gsn_herb].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_herb))
	{
		send_to_char("You can't find any more herbs.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type != SECT_FOREST
		&& ch->in_room->sector_type != SECT_HILLS
		&& ch->in_room->sector_type != SECT_MOUNTAIN)
	{
		send_to_char("You can't find any herbs here.\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		victim = ch;
	}
	else
	{
		victim = get_char_room(ch, arg);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}
	}

	if (number_percent() > get_skill(ch, gsn_herb))
	{
		send_to_char("You search for herbs but fail to find any.\n\r", ch);
		act("$n looks about in the bushes but finds nothing.", ch, 0, 0, TO_ROOM);
		check_improve(ch, gsn_herb, false, 4);
		return;
	}

	if (victim != ch)
	{
		act("$n applies herbs to $N.", ch, 0, victim, TO_NOTVICT);
		act("You apply herbs to $N.", ch, 0, victim, TO_CHAR);
		act("$n applies herbs to you.", ch, 0, victim, TO_VICT);
	}

	if (victim == ch)
	{
		act("$n applies herbs to $mself.", ch, 0, 0, TO_ROOM);
		send_to_char("You find herbs and apply them to yourself.\n\r", ch);
	}

	send_to_char("You feel better.\n\r", victim);

	if (is_affected_by(victim, AFF_PLAGUE) && number_percent() > 30)
	{
		affect_strip(victim, gsn_plague);
		act("The sores on $n's body vanish.\n\r", victim, 0, 0, TO_ROOM);
		send_to_char("The sores on your body vanish.\n\r", victim);
	}

	check_improve(ch, gsn_herb, true, 4);

	victim->hit = std::min(victim->hit + (4 * ch->level), (int)victim->max_hit);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_herb;
	af.location = 0;
	af.duration = 4;
	af.modifier = 0;
	af.aftype = AFT_SKILL;
	af.level = ch->level;
	affect_to_char(ch, &af);
}